

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::InstMatcher::DerefTask>
::~Stack(Stack<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::InstMatcher::DerefTask>
         *this)

{
  DerefTask *pDVar1;
  ulong uVar2;
  
  pDVar1 = this->_stack;
  if (pDVar1 != (DerefTask *)0x0) {
    uVar2 = this->_capacity * 0x18 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pDVar1;
      return;
    }
    if (uVar2 < 0x11) {
      (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pDVar1;
      return;
    }
    if (uVar2 < 0x19) {
      (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pDVar1;
      return;
    }
    if (uVar2 < 0x21) {
      (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pDVar1;
      return;
    }
    if (uVar2 < 0x31) {
      (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(pDVar1,0x10);
      return;
    }
    (pDVar1->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pDVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }